

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O3

void __thiscall
QtPrivate::QMovableArrayOps<QDBusMenuItem>::emplace<QDBusMenuItem>
          (QMovableArrayOps<QDBusMenuItem> *this,qsizetype i,QDBusMenuItem *args)

{
  QDBusMenuItem **ppQVar1;
  qsizetype *pqVar2;
  QDBusMenuItem *pQVar3;
  int iVar4;
  Data *pDVar5;
  QDBusMenuItem *pQVar6;
  QMapData<std::map<QString,_QVariant,_std::less<QString>,_std::allocator<std::pair<const_QString,_QVariant>_>_>_>
  *pQVar7;
  totally_ordered_wrapper<QMapData<std::map<QString,_QVariant,_std::less<QString>,_std::allocator<std::pair<const_QString,_QVariant>_>_>_>_*>
  __old_val;
  long in_FS_OFFSET;
  bool bVar8;
  QExplicitlySharedDataPointerV2<QMapData<std::map<QString,_QVariant,_std::less<QString>,_std::allocator<std::pair<const_QString,_QVariant>_>_>_>_>
  QStack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar5 = (this->super_QGenericArrayOps<QDBusMenuItem>).super_QArrayDataPointer<QDBusMenuItem>.d;
  if ((pDVar5 == (Data *)0x0) ||
     (1 < (__int_type)(pDVar5->super_QArrayData).ref_._q_value.super___atomic_base<int>)) {
LAB_0063fe6a:
    QStack_40.d.ptr =
         (totally_ordered_wrapper<QMapData<std::map<QString,_QVariant,_std::less<QString>,_std::allocator<std::pair<const_QString,_QVariant>_>_>_>_*>
          )&DAT_aaaaaaaaaaaaaaaa;
    iVar4 = args->m_id;
    pQVar7 = (args->m_properties).d.d.ptr;
    (args->m_properties).d.d.ptr =
         (QMapData<std::map<QString,_QVariant,_std::less<QString>,_std::allocator<std::pair<const_QString,_QVariant>_>_>_>
          *)0x0;
    bVar8 = (this->super_QGenericArrayOps<QDBusMenuItem>).super_QArrayDataPointer<QDBusMenuItem>.
            size != 0;
    QArrayDataPointer<QDBusMenuItem>::detachAndGrow
              ((QArrayDataPointer<QDBusMenuItem> *)this,(uint)(i == 0 && bVar8),1,
               (QDBusMenuItem **)0x0,(QArrayDataPointer<QDBusMenuItem> *)0x0);
    pQVar6 = (this->super_QGenericArrayOps<QDBusMenuItem>).super_QArrayDataPointer<QDBusMenuItem>.
             ptr;
    if (i == 0 && bVar8) {
      pQVar6[-1].m_id = iVar4;
      pQVar6[-1].m_properties.d.d.ptr = pQVar7;
      ppQVar1 = &(this->super_QGenericArrayOps<QDBusMenuItem>).
                 super_QArrayDataPointer<QDBusMenuItem>.ptr;
      *ppQVar1 = *ppQVar1 + -1;
    }
    else {
      pQVar3 = pQVar6 + i;
      memmove(pQVar3 + 1,pQVar6 + i,
              ((this->super_QGenericArrayOps<QDBusMenuItem>).super_QArrayDataPointer<QDBusMenuItem>.
               size - i) * 0x10);
      pQVar3->m_id = iVar4;
      (pQVar3->m_properties).d.d.ptr = pQVar7;
    }
    QStack_40.d.ptr =
         (totally_ordered_wrapper<QMapData<std::map<QString,_QVariant,_std::less<QString>,_std::allocator<std::pair<const_QString,_QVariant>_>_>_>_*>
          )(QMapData<std::map<QString,_QVariant,_std::less<QString>,_std::allocator<std::pair<const_QString,_QVariant>_>_>_>
            *)0x0;
    pqVar2 = &(this->super_QGenericArrayOps<QDBusMenuItem>).super_QArrayDataPointer<QDBusMenuItem>.
              size;
    *pqVar2 = *pqVar2 + 1;
    QExplicitlySharedDataPointerV2<QMapData<std::map<QString,_QVariant,_std::less<QString>,_std::allocator<std::pair<const_QString,_QVariant>_>_>_>_>
    ::~QExplicitlySharedDataPointerV2(&QStack_40);
  }
  else {
    if (((this->super_QGenericArrayOps<QDBusMenuItem>).super_QArrayDataPointer<QDBusMenuItem>.size
         == i) &&
       (pQVar6 = (this->super_QGenericArrayOps<QDBusMenuItem>).
                 super_QArrayDataPointer<QDBusMenuItem>.ptr,
       (pDVar5->super_QArrayData).alloc !=
       ((long)((long)pQVar6 -
              ((ulong)((long)&pDVar5[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0)) >> 4) +
       i)) {
      pQVar6[i].m_id = args->m_id;
      pQVar7 = (args->m_properties).d.d.ptr;
      (args->m_properties).d.d.ptr =
           (QMapData<std::map<QString,_QVariant,_std::less<QString>,_std::allocator<std::pair<const_QString,_QVariant>_>_>_>
            *)0x0;
      pQVar6[i].m_properties.d.d.ptr = pQVar7;
    }
    else {
      if ((i != 0) ||
         (pQVar6 = (this->super_QGenericArrayOps<QDBusMenuItem>).
                   super_QArrayDataPointer<QDBusMenuItem>.ptr,
         (QDBusMenuItem *)
         ((ulong)((long)&pDVar5[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0) == pQVar6))
      goto LAB_0063fe6a;
      pQVar6[-1].m_id = args->m_id;
      pQVar7 = (args->m_properties).d.d.ptr;
      (args->m_properties).d.d.ptr =
           (QMapData<std::map<QString,_QVariant,_std::less<QString>,_std::allocator<std::pair<const_QString,_QVariant>_>_>_>
            *)0x0;
      pQVar6[-1].m_properties.d.d.ptr = pQVar7;
      ppQVar1 = &(this->super_QGenericArrayOps<QDBusMenuItem>).
                 super_QArrayDataPointer<QDBusMenuItem>.ptr;
      *ppQVar1 = *ppQVar1 + -1;
    }
    pqVar2 = &(this->super_QGenericArrayOps<QDBusMenuItem>).super_QArrayDataPointer<QDBusMenuItem>.
              size;
    *pqVar2 = *pqVar2 + 1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        const bool growsAtBegin = this->size != 0 && i == 0;
        const auto pos = growsAtBegin ? Data::GrowsAtBeginning : Data::GrowsAtEnd;

        this->detachAndGrow(pos, 1, nullptr, nullptr);
        if (growsAtBegin) {
            Q_ASSERT(this->freeSpaceAtBegin());
            new (this->begin() - 1) T(std::move(tmp));
            --this->ptr;
            ++this->size;
        } else {
            Inserter(this, i, 1).insertOne(std::move(tmp));
        }
    }